

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

void __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::~ExplicitProducer
          (ExplicitProducer *this)

{
  FreeList<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block> *pFVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict1 _Var3;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *pCVar4;
  void *pvVar5;
  void *__ptr;
  ulong uVar6;
  ulong uVar7;
  __pointer_type pBVar8;
  __pointer_type pBVar9;
  Block *pBVar10;
  Block *__ptr_00;
  bool bVar11;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_002e7478;
  pBVar10 = (this->super_ProducerBase).tailBlock;
  if (pBVar10 != (Block *)0x0) {
    __ptr_00 = pBVar10;
    if ((char)(this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i != '\0')
    {
      uVar6 = this->pr_blockIndexFront - this->pr_blockIndexSlotsUsed;
      do {
        uVar7 = uVar6 & this->pr_blockIndexSize - 1;
        uVar6 = uVar7 + 1;
      } while (0x8000000000000000 <
               (this->pr_blockIndexEntries[uVar7].base -
               (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i) + 0x100
              );
    }
    do {
      pBVar10 = pBVar10->next;
      if ((pBVar10->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i == 0x100) {
        __ptr_00 = (this->super_ProducerBase).tailBlock;
      }
    } while (pBVar10 != __ptr_00);
    do {
      pBVar10 = __ptr_00->next;
      if (__ptr_00->dynamicallyAllocated == true) {
        free(__ptr_00);
      }
      else {
        pCVar4 = (this->super_ProducerBase).parent;
        LOCK();
        paVar2 = &__ptr_00->freeListRefs;
        _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
        (paVar2->super___atomic_base<unsigned_int>)._M_i =
             (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
        UNLOCK();
        if (_Var3 == 0) {
          pBVar8 = (pCVar4->freeList).freeListHead._M_b._M_p;
          do {
            (__ptr_00->freeListNext)._M_b._M_p = pBVar8;
            (__ptr_00->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
            pFVar1 = &pCVar4->freeList;
            LOCK();
            pBVar9 = (pFVar1->freeListHead)._M_b._M_p;
            bVar11 = pBVar8 == pBVar9;
            if (bVar11) {
              (pFVar1->freeListHead)._M_b._M_p = __ptr_00;
              pBVar9 = pBVar8;
            }
            UNLOCK();
            if (bVar11) break;
            LOCK();
            paVar2 = &__ptr_00->freeListRefs;
            _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
            (paVar2->super___atomic_base<unsigned_int>)._M_i =
                 (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
            UNLOCK();
            pBVar8 = pBVar9;
          } while (_Var3 == 1);
        }
      }
      __ptr_00 = pBVar10;
    } while (pBVar10 != (this->super_ProducerBase).tailBlock);
  }
  __ptr = this->pr_blockIndexRaw;
  while (__ptr != (void *)0x0) {
    pvVar5 = *(void **)((long)__ptr + 0x18);
    free(__ptr);
    __ptr = pvVar5;
  }
  return;
}

Assistant:

~ExplicitProducer()
		{
			// Destruct any elements not yet dequeued.
			// Since we're in the destructor, we can assume all elements
			// are either completely dequeued or completely not (no halfways).
			if (this->tailBlock != nullptr) {		// Note this means there must be a block index too
				// First find the block that's partially dequeued, if any
				Block* halfDequeuedBlock = nullptr;
				if ((this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) != 0) {
					// The head's not on a block boundary, meaning a block somewhere is partially dequeued
					// (or the head block is the tail block and was fully dequeued, but the head/tail are still not on a boundary)
					size_t i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & (pr_blockIndexSize - 1);
					while (details::circular_less_than<index_t>(pr_blockIndexEntries[i].base + BLOCK_SIZE, this->headIndex.load(std::memory_order_relaxed))) {
						i = (i + 1) & (pr_blockIndexSize - 1);
					}
					assert(details::circular_less_than<index_t>(pr_blockIndexEntries[i].base, this->headIndex.load(std::memory_order_relaxed)));
					halfDequeuedBlock = pr_blockIndexEntries[i].block;
				}
				
				// Start at the head block (note the first line in the loop gives us the head from the tail on the first iteration)
				auto block = this->tailBlock;
				do {
					block = block->next;
					if (block->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
						continue;
					}
					
					size_t i = 0;	// Offset into block
					if (block == halfDequeuedBlock) {
						i = static_cast<size_t>(this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					}
					
					// Walk through all the items in the block; if this is the tail block, we need to stop when we reach the tail index
					auto lastValidIndex = (this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 ? BLOCK_SIZE : static_cast<size_t>(this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					while (i != BLOCK_SIZE && (block != this->tailBlock || i != lastValidIndex)) {
						(*block)[i++]->~T();
					}
				} while (block != this->tailBlock);
			}
			
			// Destroy all blocks that we own
			if (this->tailBlock != nullptr) {
				auto block = this->tailBlock;
				do {
					auto nextBlock = block->next;
					if (block->dynamicallyAllocated) {
						destroy(block);
					}
					else {
						this->parent->add_block_to_free_list(block);
					}
					block = nextBlock;
				} while (block != this->tailBlock);
			}
			
			// Destroy the block indices
			auto header = static_cast<BlockIndexHeader*>(pr_blockIndexRaw);
			while (header != nullptr) {
				auto prev = static_cast<BlockIndexHeader*>(header->prev);
				header->~BlockIndexHeader();
				(Traits::free)(header);
				header = prev;
			}
		}